

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinType
          (Interpreter *this,LocationRange *param_2,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  const_reference pvVar1;
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *in_RDX;
  long in_RDI;
  Value VVar2;
  UString *in_stack_fffffffffffffd88;
  Interpreter *in_stack_fffffffffffffd90;
  allocator<char32_t> *in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_fffffffffffffdd0;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *this_00;
  undefined4 uStack_18c;
  undefined4 uStack_154;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_141;
  Type local_120;
  undefined4 uStack_11c;
  anon_union_8_3_4e909c26_for_v local_118;
  Type local_e8;
  undefined4 uStack_e4;
  anon_union_8_3_4e909c26_for_v local_e0;
  Type local_b0;
  undefined4 uStack_ac;
  anon_union_8_3_4e909c26_for_v local_a8;
  Type local_78;
  undefined4 uStack_74;
  anon_union_8_3_4e909c26_for_v local_70;
  Type local_30;
  undefined4 uStack_2c;
  anon_union_8_3_4e909c26_for_v local_28;
  
  pvVar1 = std::
           vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           ::operator[](in_RDX,0);
  switch(pvVar1->t) {
  case NULL_TYPE:
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x2284f1);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_fffffffffffffdd0,
               (char32_t *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
               in_stack_fffffffffffffdc0);
    VVar2 = makeString(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    local_28 = VVar2.v;
    local_30 = VVar2.t;
    *(ulong *)(in_RDI + 0x40) = CONCAT44(uStack_2c,local_30);
    *(anon_union_8_3_4e909c26_for_v *)(in_RDI + 0x48) = local_28;
    std::__cxx11::u32string::~u32string
              ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               in_stack_fffffffffffffd90);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x22858d);
    break;
  case BOOLEAN:
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x2285fc);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_fffffffffffffdd0,
               (char32_t *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
               in_stack_fffffffffffffdc0);
    VVar2 = makeString(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    local_70 = VVar2.v;
    local_78 = VVar2.t;
    *(ulong *)(in_RDI + 0x40) = CONCAT44(uStack_74,local_78);
    *(anon_union_8_3_4e909c26_for_v *)(in_RDI + 0x48) = local_70;
    std::__cxx11::u32string::~u32string
              ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               in_stack_fffffffffffffd90);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x228698);
    break;
  case NUMBER:
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x228704);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_fffffffffffffdd0,
               (char32_t *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
               in_stack_fffffffffffffdc0);
    VVar2 = makeString(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    local_a8 = VVar2.v;
    local_b0 = VVar2.t;
    *(ulong *)(in_RDI + 0x40) = CONCAT44(uStack_ac,local_b0);
    *(anon_union_8_3_4e909c26_for_v *)(in_RDI + 0x48) = local_a8;
    std::__cxx11::u32string::~u32string
              ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               in_stack_fffffffffffffd90);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x228791);
    break;
  default:
    break;
  case ARRAY:
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x2287fd);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_fffffffffffffdd0,
               (char32_t *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
               in_stack_fffffffffffffdc0);
    VVar2 = makeString(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    local_e0 = VVar2.v;
    local_e8 = VVar2.t;
    *(ulong *)(in_RDI + 0x40) = CONCAT44(uStack_e4,local_e8);
    *(anon_union_8_3_4e909c26_for_v *)(in_RDI + 0x48) = local_e0;
    std::__cxx11::u32string::~u32string
              ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               in_stack_fffffffffffffd90);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x22888a);
    break;
  case FUNCTION:
    this_00 = &local_141;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x2288f6);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (this_00,(char32_t *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
               in_stack_fffffffffffffdc0);
    VVar2 = makeString(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    local_118 = VVar2.v;
    local_120 = VVar2.t;
    *(ulong *)(in_RDI + 0x40) = CONCAT44(uStack_11c,local_120);
    *(anon_union_8_3_4e909c26_for_v *)(in_RDI + 0x48) = local_118;
    std::__cxx11::u32string::~u32string
              ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               in_stack_fffffffffffffd90);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x228983);
    break;
  case OBJECT:
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x2289ef);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_fffffffffffffdd0,
               (char32_t *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
               in_stack_fffffffffffffdc0);
    VVar2 = makeString(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    *(ulong *)(in_RDI + 0x40) = CONCAT44(uStack_154,VVar2.t);
    *(anon_union_8_3_4e909c26_for_v *)(in_RDI + 0x48) = VVar2.v;
    std::__cxx11::u32string::~u32string
              ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               in_stack_fffffffffffffd90);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x228a7c);
    break;
  case STRING:
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x228ae8);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_fffffffffffffdd0,
               (char32_t *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
               in_stack_fffffffffffffdc0);
    VVar2 = makeString(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    *(ulong *)(in_RDI + 0x40) = CONCAT44(uStack_18c,VVar2.t);
    ((anon_union_8_3_4e909c26_for_v *)(in_RDI + 0x48))->h = (HeapEntity *)VVar2.v;
    std::__cxx11::u32string::~u32string
              ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               VVar2.v.h);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x228b75);
  }
  return (AST *)0x0;
}

Assistant:

const AST *builtinType(const LocationRange &, const std::vector<Value> &args)
    {
        switch (args[0].t) {
            case Value::NULL_TYPE: scratch = makeString(U"null"); return nullptr;

            case Value::BOOLEAN: scratch = makeString(U"boolean"); return nullptr;

            case Value::NUMBER: scratch = makeString(U"number"); return nullptr;

            case Value::ARRAY: scratch = makeString(U"array"); return nullptr;

            case Value::FUNCTION: scratch = makeString(U"function"); return nullptr;

            case Value::OBJECT: scratch = makeString(U"object"); return nullptr;

            case Value::STRING: scratch = makeString(U"string"); return nullptr;
        }
        return nullptr;  // Quiet, compiler.
    }